

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

int asl::Process::exec(String *command,Array<asl::String> *args)

{
  int iVar1;
  int iVar2;
  String *this;
  char *__file;
  char **__argv;
  char *local_48;
  char *local_40;
  int local_38;
  int i;
  char *local_28;
  Array<const_char_*> local_20;
  Array<const_char_*> argv;
  Array<asl::String> *args_local;
  String *command_local;
  
  argv._a = (char **)args;
  Array<const_char_*>::Array(&local_20);
  local_28 = asl::String::operator_cast_to_char_(command);
  Array<const_char_*>::operator<<(&local_20,&local_28);
  local_38 = 0;
  while( true ) {
    iVar2 = local_38;
    iVar1 = Array<asl::String>::length((Array<asl::String> *)argv._a);
    if (iVar1 <= iVar2) break;
    this = Array<asl::String>::operator[]((Array<asl::String> *)argv._a,local_38);
    local_40 = asl::String::operator_cast_to_char_(this);
    Array<const_char_*>::operator<<(&local_20,&local_40);
    local_38 = local_38 + 1;
  }
  local_48 = (char *)0x0;
  Array<const_char_*>::operator<<(&local_20,&local_48);
  __file = asl::String::operator_cast_to_char_(command);
  __argv = Array<const_char_*>::data(&local_20);
  iVar2 = execvp(__file,__argv);
  Array<const_char_*>::~Array(&local_20);
  return iVar2;
}

Assistant:

int Process::exec(const String& command, const Array<String>& args)
{
	Array<const char*> argv;
	argv << command;
	for(int i=0; i<args.length(); i++)
		argv << args[i];
	argv << 0;
	return execvp(command, (char* const*)argv.data());
}